

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

FilterTypes __thiscall helics::filterTypeFromString(helics *this,string_view filterType)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  const_iterator cVar4;
  FilterTypes FVar5;
  size_type sVar6;
  string nfilt;
  key_type local_40;
  string_view filterType_local;
  
  filterType_local._M_str = (char *)filterType._M_len;
  filterType_local._M_len = (size_t)this;
  cVar4 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>_>
          ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>_>
                  *)filterTypes,&filterType_local);
  if (cVar4._M_node == (_Base_ptr)(filterTypes + 8)) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&nfilt,
               (basic_string_view<char,_std::char_traits<char>_> *)&filterType_local,
               (allocator<char> *)&local_40);
    sVar2 = nfilt._M_string_length;
    _Var1 = nfilt._M_dataplus;
    for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
      iVar3 = tolower((int)_Var1._M_p[sVar6]);
      _Var1._M_p[sVar6] = (char)iVar3;
    }
    local_40._M_len = nfilt._M_string_length;
    local_40._M_str = nfilt._M_dataplus._M_p;
    cVar4 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>_>
            ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>_>
                    *)filterTypes,&local_40);
    if (cVar4._M_node == (_Base_ptr)(filterTypes + 8)) {
      FVar5 = UNRECOGNIZED;
    }
    else {
      FVar5 = *(FilterTypes *)&cVar4._M_node[1]._M_left;
    }
    std::__cxx11::string::~string((string *)&nfilt);
  }
  else {
    FVar5 = *(FilterTypes *)&cVar4._M_node[1]._M_left;
  }
  return FVar5;
}

Assistant:

FilterTypes filterTypeFromString(std::string_view filterType) noexcept
{
    auto fnd = filterTypes.find(filterType);
    if (fnd != filterTypes.end()) {
        return fnd->second;
    }
    std::string nfilt{filterType};
    std::transform(nfilt.begin(), nfilt.end(), nfilt.begin(), ::tolower);
    fnd = filterTypes.find(nfilt);
    if (fnd != filterTypes.end()) {
        return fnd->second;
    }
    return FilterTypes::UNRECOGNIZED;
}